

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

Gia_Man_t * Abc_NtkDeriveFlatGia2(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  int iVar1;
  Vec_Ptr_t *vOrder_00;
  Gia_Man_t *pGVar2;
  void *pvVar3;
  int local_34;
  int i;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vOrder;
  Vec_Ptr_t *vModels_local;
  Abc_Ntk_t *pNtk_local;
  
  pGia = (Gia_Man_t *)0x0;
  for (local_34 = 0; iVar1 = Vec_PtrSize(vModels), local_34 < iVar1; local_34 = local_34 + 1) {
    pGia = (Gia_Man_t *)Vec_PtrEntry(vModels,local_34);
    vOrder_00 = Abc_NtkDfsBoxes((Abc_Ntk_t *)pGia);
    pGVar2 = Abc_NtkDeriveFlatGia2Derive((Abc_Ntk_t *)pGia,vOrder_00);
    pGia->vSeqModelVec = (Vec_Ptr_t *)pGVar2;
    Vec_PtrFree(vOrder_00);
  }
  pGVar2 = (Gia_Man_t *)pGia->vSeqModelVec;
  pGia->vSeqModelVec = (Vec_Ptr_t *)0x0;
  for (local_34 = 0; iVar1 = Vec_PtrSize(vModels), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(vModels,local_34);
    Gia_ManStopP((Gia_Man_t **)((long)pvVar3 + 0x158));
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{ 
    Vec_Ptr_t * vOrder;
    Abc_Ntk_t * pModel = NULL;
    Gia_Man_t * pGia = NULL;
    int i;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
    {
        vOrder = Abc_NtkDfsBoxes( pModel );
        pModel->pData = Abc_NtkDeriveFlatGia2Derive( pModel, vOrder );
        Vec_PtrFree( vOrder );
    }

    pGia = (Gia_Man_t *)pModel->pData;  pModel->pData = NULL;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
        Gia_ManStopP( (Gia_Man_t **)&pModel->pData );

    return pGia;
}